

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O2

uint32_t SharpYuvGammaToLinear(uint16_t v,int bit_depth,SharpYuvTransferFunctionType transfer_type)

{
  uint32_t uVar1;
  uint uVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  double __y;
  
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    if (bit_depth < 10) {
      return kGammaToLinearTabS[(int)((uint)v << (10 - (byte)bit_depth & 0x1f))];
    }
    uVar1 = FixedPointInterpolation((uint)v,kGammaToLinearTabS,bit_depth + -10,0);
    return uVar1;
  }
  fVar5 = 0.0;
  if (0x11 < transfer_type - kSharpYuvTransferFunctionBt709) goto switchD_00142d5c_caseD_2;
  uVar2 = (uint)v;
  fVar3 = (float)uVar2 / (float)~(-1 << ((byte)bit_depth & 0x1f));
  fVar5 = 0.0;
  switch(transfer_type) {
  default:
    if (0.08124286 <= fVar3) {
      fVar5 = 1.0;
      if (fVar3 < 1.0) goto LAB_00142e10;
    }
    else {
LAB_00142d6b:
      fVar5 = fVar3 / 4.5;
    }
    break;
  case 2:
  case 3:
  case kSharpYuvTransferFunctionSrgb:
    break;
  case kSharpYuvTransferFunctionBt470M:
    fVar5 = 1.0;
    if (fVar3 <= 1.0) {
      fVar5 = fVar3;
    }
    dVar4 = (double)fVar5;
    __y = 2.200000047683716;
    goto LAB_00142f10;
  case kSharpYuvTransferFunctionBt470Bg:
    fVar5 = 1.0;
    if (fVar3 <= 1.0) {
      fVar5 = fVar3;
    }
    dVar4 = (double)fVar5;
    __y = 2.799999952316284;
    goto LAB_00142f10;
  case kSharpYuvTransferFunctionSmpte240:
    if (fVar3 < 0.09128634) {
      fVar5 = fVar3 * 0.25;
    }
    else {
      fVar5 = 1.0;
      if (fVar3 < 1.0) {
        fVar5 = (fVar3 + 0.1115722) / 1.1115721;
        goto LAB_00142e20;
      }
    }
    break;
  case kSharpYuvTransferFunctionLinear:
    goto switchD_00142d5c_caseD_8;
  case kSharpYuvTransferFunctionLog100:
    if (0.0 < fVar3) {
      if (1.0 <= fVar3) {
        fVar3 = 1.0;
      }
      fVar5 = fVar3 + -1.0 + fVar3 + -1.0;
LAB_00142f04:
      __y = (double)fVar5;
      dVar4 = 10.0;
      goto LAB_00142f10;
    }
    fVar5 = 0.005;
    break;
  case kSharpYuvTransferFunctionLog100_Sqrt10:
    if (0.0 < fVar3) {
      if (1.0 <= fVar3) {
        fVar3 = 1.0;
      }
      fVar5 = (fVar3 + -1.0) * 2.5;
      goto LAB_00142f04;
    }
    fVar5 = 0.0015811388;
    break;
  case kSharpYuvTransferFunctionIec61966:
    if (fVar3 < 0.08124286) goto LAB_00142d6b;
LAB_00142e10:
    fVar5 = (fVar3 + 0.09929682) / 1.0992968;
LAB_00142e20:
    dVar4 = (double)fVar5;
    __y = 2.222222328186035;
LAB_00142f10:
    dVar4 = pow(dVar4,__y);
    fVar5 = (float)dVar4;
    break;
  case kSharpYuvTransferFunctionSmpte2084:
    fVar5 = 0.0;
    if (0.0 < fVar3) {
      dVar4 = pow((double)fVar3,0.012683313339948654);
      fVar5 = (float)dVar4 + -0.8359375;
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      fVar3 = (float)dVar4 * -18.6875 + 18.851562;
      if (fVar3 <= 1.1754944e-38) {
        fVar3 = 1.1754944e-38;
      }
      dVar4 = (double)(fVar5 / fVar3);
      __y = 6.27258825302124;
      goto LAB_00142f10;
    }
    break;
  case kSharpYuvTransferFunctionSmpte428:
    if (fVar3 <= 0.0) {
      fVar3 = 0.0;
    }
    dVar4 = pow((double)fVar3,2.5999999046325684);
    fVar5 = (float)dVar4 / 0.9165553;
    break;
  case kSharpYuvTransferFunctionHlg:
    if (fVar3 <= 0.5) {
      fVar5 = fVar3 * fVar3 * 0.33333334;
    }
    else {
      fVar5 = expf((fVar3 + -0.5599107) / 0.17883277);
      fVar5 = (fVar5 + 0.28466892) / 12.0;
    }
    dVar4 = pow((double)fVar5,1.2000000476837158);
    fVar5 = (float)dVar4;
  }
switchD_00142d5c_caseD_2:
  fVar5 = fVar5 * 65535.0;
  if (0.0 <= fVar5) {
    fVar5 = floorf(fVar5 + 0.5);
  }
  else {
    fVar5 = ceilf(fVar5 + -0.5);
  }
  uVar2 = (uint)(long)fVar5;
switchD_00142d5c_caseD_8:
  return uVar2;
}

Assistant:

uint32_t SharpYuvGammaToLinear(uint16_t v, int bit_depth,
                               SharpYuvTransferFunctionType transfer_type) {
  float v_float, linear;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    return ToLinearSrgb(v, bit_depth);
  }
  v_float = (float)v / ((1 << bit_depth) - 1);
  switch (transfer_type) {
    case kSharpYuvTransferFunctionBt709:
    case kSharpYuvTransferFunctionBt601:
    case kSharpYuvTransferFunctionBt2020_10Bit:
    case kSharpYuvTransferFunctionBt2020_12Bit:
      linear = ToLinear709(v_float);
      break;
    case kSharpYuvTransferFunctionBt470M:
      linear = ToLinear470M(v_float);
      break;
    case kSharpYuvTransferFunctionBt470Bg:
      linear = ToLinear470Bg(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte240:
      linear = ToLinearSmpte240(v_float);
      break;
    case kSharpYuvTransferFunctionLinear:
      return v;
    case kSharpYuvTransferFunctionLog100:
      linear = ToLinearLog100(v_float);
      break;
    case kSharpYuvTransferFunctionLog100_Sqrt10:
      linear = ToLinearLog100Sqrt10(v_float);
      break;
    case kSharpYuvTransferFunctionIec61966:
      linear = ToLinearIec61966(v_float);
      break;
    case kSharpYuvTransferFunctionBt1361:
      linear = ToLinearBt1361(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte2084:
      linear = ToLinearPq(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte428:
      linear = ToLinearSmpte428(v_float);
      break;
    case kSharpYuvTransferFunctionHlg:
      linear = ToLinearHlg(v_float);
      break;
    default:
      assert(0);
      linear = 0;
      break;
  }
  return (uint32_t)Roundf(linear * ((1 << 16) - 1));
}